

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> * chrono::Qcross(ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChQuaternion<double> *res;
  ChQuaternion<double> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI->m_data[3] = 0.0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = qa->m_data[0];
  dVar1 = qa->m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  dVar2 = qb->m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = qb->m_data[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = qb->m_data[1] * dVar1;
  auVar7 = vfmsub231sd_fma(auVar10,auVar5,auVar7);
  dVar3 = qa->m_data[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = qb->m_data[2];
  auVar7 = vfnmadd231sd_fma(auVar7,auVar13,auVar14);
  dVar4 = qa->m_data[3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = qb->m_data[3];
  auVar7 = vfnmadd231sd_fma(auVar7,auVar15,auVar16);
  in_RDI->m_data[0] = auVar7._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * dVar1;
  auVar7 = vfmadd231sd_fma(auVar11,auVar5,auVar9);
  auVar7 = vfnmadd231sd_fma(auVar7,auVar15,auVar14);
  auVar7 = vfmadd231sd_fma(auVar7,auVar13,auVar16);
  in_RDI->m_data[1] = auVar7._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2 * dVar3;
  auVar7 = vfmadd231sd_fma(auVar12,auVar5,auVar14);
  auVar7 = vfmadd231sd_fma(auVar7,auVar15,auVar9);
  auVar7 = vfnmadd231sd_fma(auVar7,auVar6,auVar16);
  in_RDI->m_data[2] = auVar7._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2 * dVar4;
  auVar7 = vfmadd231sd_fma(auVar8,auVar5,auVar16);
  auVar7 = vfnmadd231sd_fma(auVar7,auVar13,auVar9);
  auVar7 = vfmadd231sd_fma(auVar7,auVar6,auVar14);
  in_RDI->m_data[3] = auVar7._0_8_;
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qcross(const ChQuaternion<double>& qa, const ChQuaternion<double>& qb) {
    ChQuaternion<double> res;
    res.e0() = qa.e0() * qb.e0() - qa.e1() * qb.e1() - qa.e2() * qb.e2() - qa.e3() * qb.e3();
    res.e1() = qa.e0() * qb.e1() + qa.e1() * qb.e0() - qa.e3() * qb.e2() + qa.e2() * qb.e3();
    res.e2() = qa.e0() * qb.e2() + qa.e2() * qb.e0() + qa.e3() * qb.e1() - qa.e1() * qb.e3();
    res.e3() = qa.e0() * qb.e3() + qa.e3() * qb.e0() - qa.e2() * qb.e1() + qa.e1() * qb.e2();
    return (res);
}